

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O2

void __thiscall chrono::ChSolverADMM::ArchiveOUT(ChSolverADMM *this,ChArchiveOut *marchive)

{
  AdmmStepType_mapper mmapper;
  ChEnumMapper<chrono::ChSolverADMM::AdmmStepType> CStack_158;
  ChEnumMapper<chrono::ChSolverADMM::AdmmStepType> local_138;
  ChNameValue<chrono::ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>_> local_118;
  ChNameValue<double> local_100;
  ChNameValue<double> local_e8;
  ChNameValue<double> local_d0;
  ChNameValue<double> local_b8;
  ChNameValue<int> local_a0;
  ChNameValue<double> local_88;
  ChNameValue<double> local_70;
  ChNameValue<double> local_58;
  ChNameValue<bool> local_40;
  
  ChArchiveOut::VersionWrite<chrono::ChSolverADMM>(marchive);
  ChIterativeSolverVI::ArchiveOUT(&this->super_ChIterativeSolverVI,marchive);
  local_40._value = &this->precond;
  local_40._name = "precond";
  local_40._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_40);
  local_58._value = &this->rho;
  local_58._name = "rho";
  local_58._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_58);
  local_70._value = &this->rho_b;
  local_70._name = "rho_b";
  local_70._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_70);
  local_88._value = &this->sigma;
  local_88._name = "sigma";
  local_88._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_88);
  local_a0._value = &this->stepadjust_each;
  local_a0._name = "stepadjust_each";
  local_a0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a0);
  local_b8._value = &this->stepadjust_threshold;
  local_b8._name = "stepadjust_threshold";
  local_b8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_b8);
  local_d0._value = &this->stepadjust_maxfactor;
  local_d0._name = "stepadjust_maxfactor";
  local_d0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_d0);
  local_e8._value = &this->tol_prim;
  local_e8._name = "tol_prim";
  local_e8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_e8);
  local_100._value = &this->tol_dual;
  local_100._name = "tol_dual";
  local_100._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_100);
  my_enum_mappers::AdmmStepType_mapper::AdmmStepType_mapper((AdmmStepType_mapper *)&local_138);
  my_enum_mappers::AdmmStepType_mapper::operator()
            (&CStack_158,(AdmmStepType_mapper *)&local_138,&this->stepadjust_type);
  local_118._name = "stepadjust_type";
  local_118._flags = '\0';
  local_118._value = &CStack_158;
  ChArchiveOut::operator<<(marchive,&local_118);
  ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>::~ChEnumMapper(&CStack_158);
  ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>::~ChEnumMapper(&local_138);
  return;
}

Assistant:

void ChSolverADMM::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSolverADMM>();
    // serialize parent class
    ChIterativeSolverVI::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(precond);
    marchive << CHNVP(rho);
    marchive << CHNVP(rho_b);
    marchive << CHNVP(sigma);
    marchive << CHNVP(stepadjust_each);
    marchive << CHNVP(stepadjust_threshold);
    marchive << CHNVP(stepadjust_maxfactor);
    marchive << CHNVP(tol_prim);
    marchive << CHNVP(tol_dual);
    my_enum_mappers::AdmmStepType_mapper mmapper;
    marchive << CHNVP(mmapper(this->stepadjust_type), "stepadjust_type");
}